

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

void absl::lts_20250127::synchronization_internal::MoveToList(Rep *r,Vec<int> *src,Vec<int> *dst)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Node *pNVar4;
  undefined8 in_RAX;
  long lVar5;
  int32_t w;
  undefined8 uStack_38;
  
  uVar1 = src->size_;
  if ((ulong)uVar1 != 0) {
    piVar3 = src->ptr_;
    lVar5 = 0;
    uStack_38 = in_RAX;
    do {
      uVar2 = *(uint *)((long)piVar3 + lVar5);
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
      pNVar4 = (r->nodes_).ptr_[uVar2];
      *(int32_t *)((long)piVar3 + lVar5) = pNVar4->rank;
      pNVar4->visited = false;
      anon_unknown_0::Vec<int>::push_back(dst,(int *)((long)&uStack_38 + 4));
      lVar5 = lVar5 + 4;
    } while ((ulong)uVar1 << 2 != lVar5);
  }
  return;
}

Assistant:

T* end() { return ptr_ + size_; }